

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

bool __thiscall wabt::WastParser::ParseRefTypeOpt(WastParser *this,Type *out_type)

{
  bool bVar1;
  Enum EVar2;
  Type local_68;
  Type type;
  Token token;
  Type *out_type_local;
  WastParser *this_local;
  
  bVar1 = PeekMatch(this,First_Type,0);
  if (bVar1) {
    Consume((Token *)&type,this);
    local_68 = Token::type((Token *)&type);
    EVar2 = Type::operator_cast_to_Enum(&local_68);
    if ((EVar2 == ExternRef) &&
       (bVar1 = Features::reference_types_enabled(&this->options_->features), !bVar1)) {
      return false;
    }
    *out_type = local_68;
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool WastParser::ParseRefTypeOpt(Type* out_type) {
  WABT_TRACE(ParseRefTypeOpt);
  if (!PeekMatch(TokenType::ValueType)) {
    return false;
  }

  Token token = Consume();
  Type type = token.type();
  if (type == Type::ExternRef &&
      !options_->features.reference_types_enabled()) {
    return false;
  }

  *out_type = type;
  return true;
}